

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_sort.c
# Opt level: O2

REF_STATUS ref_sort_insertion_int(REF_INT n,REF_INT *original,REF_INT *sorted)

{
  REF_INT RVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  uVar4 = 0;
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    sorted[uVar4] = original[uVar4];
  }
  uVar4 = 1;
  for (uVar5 = 0; uVar5 != uVar3; uVar5 = uVar5 + 1) {
    uVar8 = uVar5 & 0xffffffff;
    for (uVar6 = uVar4; iVar7 = (int)uVar8, (int)uVar6 < n; uVar6 = uVar6 + 1) {
      uVar2 = uVar6 & 0xffffffff;
      if (sorted[iVar7] <= sorted[uVar6]) {
        uVar2 = uVar8;
      }
      uVar8 = uVar2;
    }
    RVar1 = sorted[uVar5];
    sorted[uVar5] = sorted[iVar7];
    sorted[iVar7] = RVar1;
    uVar4 = uVar4 + 1;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_sort_insertion_int(REF_INT n, REF_INT *original,
                                          REF_INT *sorted) {
  REF_INT i, j, smallest, temp;

  for (i = 0; i < n; i++) sorted[i] = original[i];

  for (i = 0; i < n; i++) {
    smallest = i;
    for (j = i + 1; j < n; j++) {
      if (sorted[j] < sorted[smallest]) smallest = j;
    }
    temp = sorted[i];
    sorted[i] = sorted[smallest];
    sorted[smallest] = temp;
  }

  return REF_SUCCESS;
}